

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O0

bool ON_VersionNumberIsValid(uint version_number)

{
  uint uVar1;
  uint local_28;
  uint v;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_branch;
  uint version_minor;
  uint version_major;
  bool rc;
  uint version_number_local;
  
  version_major = version_number;
  uVar1 = ON_VersionNumberMinimum(1);
  version_minor._3_1_ = uVar1 <= version_number;
  if ((bool)version_minor._3_1_) {
    version_branch = 0;
    version_year = 0;
    version_month = 0;
    version_day_of_month = 0;
    v = 0;
    local_28 = 0;
    version_minor._3_1_ =
         ON_VersionNumberParse
                   (version_major,&version_branch,&version_year,&version_day_of_month,&v,&local_28,
                    &version_month);
    if (((bool)version_minor._3_1_) &&
       (uVar1 = ON_VersionNumberConstruct
                          (version_branch,version_year,version_day_of_month,v,local_28,version_month
                          ), uVar1 != version_major)) {
      version_minor._3_1_ = 0;
    }
  }
  return (bool)(version_minor._3_1_ & 1);
}

Assistant:

bool ON_VersionNumberIsValid(
  unsigned int version_number
  )
{
  bool rc = ( version_number >= ON_VersionNumberMinimum(1) );
  if (rc)
  {
    unsigned int version_major = 0;
    unsigned int version_minor = 0;
    unsigned int version_branch = 0;
    unsigned int version_year = 0;
    unsigned int version_month = 0;
    unsigned int version_day_of_month = 0;
    rc = ON_VersionNumberParse(
      version_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_branch
      );
    if (rc)
    {
      const unsigned int v = ON_VersionNumberConstruct(version_major,version_minor,version_year,version_month,version_day_of_month,version_branch);
      if ( v != version_number )
        rc = false;
    }
  }

  return rc;
}